

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

int glfwExtensionSupported(char *extension)

{
  int iVar1;
  undefined8 in_RAX;
  _GLFWwindow *p_Var2;
  GLubyte *pGVar3;
  uint uVar4;
  char *format;
  GLint count;
  undefined8 uStack_28;
  
  if (_glfwInitialized == '\0') {
    iVar1 = 0x10001;
  }
  else {
    uStack_28 = in_RAX;
    p_Var2 = _glfwPlatformGetCurrentContext();
    if (p_Var2 == (_GLFWwindow *)0x0) {
      iVar1 = 0x10002;
    }
    else {
      if (*extension != '\0') {
        if (2 < (p_Var2->context).major) {
          (*p_Var2->GetIntegerv)(0x821d,(GLint *)((long)&uStack_28 + 4));
          if (0 < uStack_28._4_4_) {
            uVar4 = 0;
            do {
              pGVar3 = (*p_Var2->GetStringi)(0x1f03,uVar4);
              if (pGVar3 == (GLubyte *)0x0) {
                _glfwInputError(0x10008,"Failed to retrieve extension string %i",(ulong)uVar4);
                return 0;
              }
              iVar1 = strcmp((char *)pGVar3,extension);
              if (iVar1 == 0) {
                return 1;
              }
              uVar4 = uVar4 + 1;
            } while ((int)uVar4 < uStack_28._4_4_);
          }
LAB_0010794b:
          iVar1 = _glfwPlatformExtensionSupported(extension);
          return iVar1;
        }
        pGVar3 = (*p_Var2->GetString)(0x1f03);
        if (pGVar3 != (GLubyte *)0x0) {
          iVar1 = _glfwStringInExtensionString(extension,(char *)pGVar3);
          if (iVar1 != 0) {
            return 1;
          }
          goto LAB_0010794b;
        }
        format = "Failed to retrieve extension string";
        iVar1 = 0x10008;
        goto LAB_00107910;
      }
      iVar1 = 0x10004;
    }
  }
  format = (char *)0x0;
LAB_00107910:
  _glfwInputError(iVar1,format);
  return 0;
}

Assistant:

GLFWAPI int glfwExtensionSupported(const char* extension)
{
    _GLFWwindow* window;

    _GLFW_REQUIRE_INIT_OR_RETURN(GL_FALSE);

    window = _glfwPlatformGetCurrentContext();
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT, NULL);
        return GL_FALSE;
    }

    if (*extension == '\0')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GL_FALSE;
    }

#if defined(_GLFW_USE_OPENGL)
    if (window->context.major >= 3)
    {
        int i;
        GLint count;

        // Check if extension is in the modern OpenGL extensions string list

        window->GetIntegerv(GL_NUM_EXTENSIONS, &count);

        for (i = 0;  i < count;  i++)
        {
            const char* en = (const char*) window->GetStringi(GL_EXTENSIONS, i);
            if (!en)
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Failed to retrieve extension string %i", i);
                return GL_FALSE;
            }

            if (strcmp(en, extension) == 0)
                return GL_TRUE;
        }
    }
    else
#endif // _GLFW_USE_OPENGL
    {
        // Check if extension is in the old style OpenGL extensions string

        const char* extensions = (const char*) window->GetString(GL_EXTENSIONS);
        if (!extensions)
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Failed to retrieve extension string");
            return GL_FALSE;
        }

        if (_glfwStringInExtensionString(extension, extensions))
            return GL_TRUE;
    }

    // Check if extension is in the platform-specific string
    return _glfwPlatformExtensionSupported(extension);
}